

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall boost::python::list::append<short>(list *this,short *x)

{
  object_base local_10;
  
  local_10.m_ptr = api::object_initializer_impl<false,_false>::get<short>(x);
  detail::list_base::append(&this->super_list_base,(object *)&local_10);
  api::object_base::~object_base(&local_10);
  return;
}

Assistant:

void append(T const& x)
    {
        base::append(object(x));
    }